

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::ReadIntoBuffer(BamStandardIndex *this,uint *bytesRequested)

{
  ulong uVar1;
  ostream *poVar2;
  undefined8 uVar3;
  char **in_RSI;
  long in_RDI;
  stringstream s;
  int64_t bytesRead;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 uVar4;
  string *in_stack_fffffffffffffe08;
  BamException *in_stack_fffffffffffffe10;
  allocator local_1d1;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [368];
  uint *in_stack_ffffffffffffffe0;
  uint *in_stack_ffffffffffffffe8;
  
  CheckBufferSize(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  uVar1 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x28))
                    (*(long **)(in_RDI + 0x58),*(undefined8 *)(in_RDI + 0x60),*(uint *)in_RSI);
  if (uVar1 != *(uint *)in_RSI) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"expected to read: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)in_RSI);
    poVar2 = std::operator<<(poVar2," bytes, ");
    poVar2 = std::operator<<(poVar2,"but instead read: ");
    std::ostream::operator<<(poVar2,uVar1);
    uVar4 = 1;
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"BamStandardIndex::ReadIntoBuffer",&local_1d1);
    std::__cxx11::stringstream::str();
    BamException::BamException
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (string *)CONCAT17(uVar4,in_stack_fffffffffffffe00));
    __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::ReadIntoBuffer(const unsigned int& bytesRequested)
{

    // ensure that our buffer is big enough for request
    BamStandardIndex::CheckBufferSize(m_resources.Buffer, m_bufferLength, bytesRequested);

    // read from BAI file stream
    const int64_t bytesRead = m_resources.Device->Read(m_resources.Buffer, bytesRequested);
    if (bytesRead != static_cast<int64_t>(bytesRequested)) {
        std::stringstream s;
        s << "expected to read: " << bytesRequested << " bytes, "
          << "but instead read: " << bytesRead;
        throw BamException("BamStandardIndex::ReadIntoBuffer", s.str());
    }
}